

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall
TPZEqnArray<std::complex<long_double>_>::EqnBackward
          (TPZEqnArray<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *U,
          DecomposeType dec)

{
  longdouble lVar1;
  int iVar2;
  int *piVar3;
  int in_EDX;
  TPZFMatrix<std::complex<long_double>_> *in_RSI;
  TPZEqnArray<std::complex<long_double>_> *in_RDI;
  int i_1;
  complex<long_double> acum_1;
  int last_term_1;
  int index_1;
  int i;
  complex<long_double> acum;
  int last_term;
  int index;
  int n;
  complex<long_double> *pcVar4;
  undefined2 uVar5;
  undefined6 in_stack_fffffffffffffeb2;
  undefined2 uVar6;
  undefined6 in_stack_fffffffffffffec2;
  int64_t in_stack_fffffffffffffec8;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffed0;
  complex<long_double> *in_stack_ffffffffffffff18;
  int local_ac;
  complex<long_double> local_a8;
  int local_80;
  int local_7c;
  int local_4c;
  complex<long_double> local_48;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  TPZFMatrix<std::complex<long_double>_> *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  iVar2 = IsSymmetric(in_RDI);
  if (iVar2 == 1) {
    local_18 = in_RDI->fNumEq;
    while (local_18 = local_18 + -1, -1 < local_18) {
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
      local_1c = *piVar3;
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(local_18 + 1));
      local_20 = *piVar3;
      lVar1 = (longdouble)0;
      pcVar4 = SUB108(lVar1,0);
      uVar5 = (undefined2)((unkuint10)lVar1 >> 0x40);
      uVar6 = uVar5;
      std::complex<long_double>::complex(&local_48,lVar1,lVar1);
      local_4c = local_1c;
      while (local_4c = local_4c + 1, local_4c < local_20) {
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_4c);
        in_stack_ffffffffffffff18 =
             TPZFMatrix<std::complex<long_double>_>::operator()
                       (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                        CONCAT62(in_stack_fffffffffffffec2,uVar6));
        TPZVec<std::complex<long_double>_>::operator[]
                  ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues,(long)local_4c);
        std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffeb2,uVar5),pcVar4);
        std::complex<long_double>::operator-=
                  ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffeb2,uVar5),pcVar4);
      }
      TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
      TPZFMatrix<std::complex<long_double>_>::operator()
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 CONCAT62(in_stack_fffffffffffffec2,uVar6));
      std::complex<long_double>::operator+=
                ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffeb2,uVar5),pcVar4);
      if (local_14 == 3) {
        TPZVec<std::complex<long_double>_>::operator[]
                  ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues,(long)local_1c);
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
        TPZFMatrix<std::complex<long_double>_>::operator()
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   CONCAT62(in_stack_fffffffffffffec2,uVar6));
        std::complex<long_double>::operator/=
                  ((complex<long_double> *)in_RDI,in_stack_ffffffffffffff18);
      }
    }
  }
  else {
    iVar2 = IsSymmetric(in_RDI);
    if (iVar2 == 2) {
      local_18 = in_RDI->fNumEq;
      while (local_18 = local_18 + -2, -1 < local_18) {
        piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
        local_7c = *piVar3;
        piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(local_18 + 1));
        local_80 = *piVar3;
        lVar1 = (longdouble)0;
        pcVar4 = SUB108(lVar1,0);
        uVar5 = (undefined2)((unkuint10)lVar1 >> 0x40);
        uVar6 = uVar5;
        std::complex<long_double>::complex(&local_a8,lVar1,lVar1);
        local_ac = local_7c;
        while (local_ac = local_ac + 1, local_ac < local_80) {
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_ac);
          TPZFMatrix<std::complex<long_double>_>::operator()
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     CONCAT62(in_stack_fffffffffffffec2,uVar6));
          TPZVec<std::complex<long_double>_>::operator[]
                    ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues,(long)local_ac);
          std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffeb2,uVar5),pcVar4);
          std::complex<long_double>::operator-=
                    ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffeb2,uVar5),pcVar4);
        }
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_7c);
        TPZFMatrix<std::complex<long_double>_>::operator()
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   CONCAT62(in_stack_fffffffffffffec2,uVar6));
        std::complex<long_double>::operator+=
                  ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffeb2,uVar5),pcVar4);
        if ((local_14 == 3) || (local_14 == 1)) {
          TPZVec<std::complex<long_double>_>::operator[]
                    ((TPZVec<std::complex<long_double>_> *)&in_RDI->fEqValues,(long)local_7c);
          in_stack_fffffffffffffed0 = local_10;
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_7c);
          TPZFMatrix<std::complex<long_double>_>::operator()
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     CONCAT62(in_stack_fffffffffffffec2,uVar6));
          std::complex<long_double>::operator/=
                    ((complex<long_double> *)in_RDI,in_stack_ffffffffffffff18);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}